

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

JSON __thiscall
QPDFObjectHandle::getJSON(QPDFObjectHandle *this,int json_version,bool dereference_indirect)

{
  element_type *peVar1;
  logic_error *this_00;
  int in_ECX;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  QPDFObjectHandle *this_01;
  JSON JVar3;
  Pl_Buffer p;
  string local_60;
  Writer jw;
  
  this_01 = (QPDFObjectHandle *)CONCAT44(in_register_00000034,json_version);
  peVar1 = (this_01->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (in_ECX == 0) {
    if (peVar1 == (element_type *)0x0) goto LAB_0019ab4d;
    if ((peVar1->og).obj != 0) {
      unparse_abi_cxx11_((string *)&p,this_01);
      JSON::makeString((string *)this);
      std::__cxx11::string::~string((string *)&p);
      _Var2._M_pi = extraout_RDX;
      goto LAB_0019ab3d;
    }
  }
  else if (peVar1 == (element_type *)0x0) {
LAB_0019ab4d:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"attempted to dereference an uninitialized QPDFObjectHandle");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  Pl_Buffer::Pl_Buffer(&p,"json",(Pipeline *)0x0);
  jw.first = true;
  jw.indent = 0;
  jw.p = &p.super_Pipeline;
  writeJSON(this_01,(int)CONCAT71(in_register_00000011,dereference_indirect),&jw,SUB41(in_ECX,0));
  Pl_Buffer::finish(&p);
  Pl_Buffer::getString_abi_cxx11_(&local_60,&p);
  JSON::parse((JSON *)this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  Pl_Buffer::~Pl_Buffer(&p);
  _Var2._M_pi = extraout_RDX_00;
LAB_0019ab3d:
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFObjectHandle::getJSON(int json_version, bool dereference_indirect) const
{
    if ((!dereference_indirect) && isIndirect()) {
        return JSON::makeString(unparse());
    } else if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    } else {
        Pl_Buffer p{"json"};
        JSON::Writer jw{&p, 0};
        writeJSON(json_version, jw, dereference_indirect);
        p.finish();
        return JSON::parse(p.getString());
    }
}